

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::Image::setSearchPath(char *path)

{
  undefined8 *puVar1;
  ImageGlobals *pIVar2;
  bool bVar3;
  ImageGlobals *g;
  char *end;
  char *p;
  char *path_local;
  
  puVar1 = (undefined8 *)(engine + imageModuleOffset);
  (*DAT_00168638)(*puVar1);
  *(undefined4 *)(puVar1 + 1) = 0;
  if (path == (char *)0x0) {
    *puVar1 = 0;
  }
  else {
    end = strdup_LOC(path,0x30000,
                     "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 905"
                    );
    *puVar1 = end;
    while( true ) {
      bVar3 = false;
      if (end != (char *)0x0) {
        bVar3 = *end != '\0';
      }
      if (!bVar3) break;
      pIVar2 = (ImageGlobals *)strchr(end,0x3b);
      g = pIVar2;
      if (pIVar2 != (ImageGlobals *)0x0) {
        g = (ImageGlobals *)((long)&pIVar2->searchPaths + 1);
        *(char *)&pIVar2->searchPaths = '\0';
      }
      *(int *)(puVar1 + 1) = *(int *)(puVar1 + 1) + 1;
      end = (char *)g;
    }
  }
  return;
}

Assistant:

void
Image::setSearchPath(const char *path)
{
	char *p, *end;
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	rwFree(g->searchPaths);
	g->numSearchPaths = 0;
	if(path)
		g->searchPaths = p = rwStrdup(path, MEMDUR_EVENT);
	else{
		g->searchPaths = nil;
		return;
	}
	while(p && *p){
		end = strchr(p, ';');
		if(end)
			*end++ = '\0';
		g->numSearchPaths++;
		p = end;
	}
}